

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findMetadataVariableNames.cpp
# Opt level: O3

void findMetadataVariableNames(Module *module,Program *program)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  Module *pMVar6;
  long lVar7;
  Expr *expr;
  char *pcVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  long extraout_RDX;
  Function *pFVar12;
  BasicBlock *pBVar13;
  char cVar14;
  BasicBlock *pBVar15;
  Function *pFVar16;
  ulong __val;
  undefined1 auVar17 [16];
  string name;
  key_type local_a8;
  key_type local_88;
  Program *local_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_60;
  Block *local_58;
  Module *local_50;
  Module *local_48;
  Function *local_40;
  Func *local_38;
  
  pMVar6 = *(Module **)(module + 0x20);
  local_50 = module + 0x18;
  local_68 = program;
  if (pMVar6 != local_50) {
    do {
      pFVar12 = (Function *)(pMVar6 + -0x38);
      if (pMVar6 == (Module *)0x0) {
        pFVar12 = (Function *)0x0;
      }
      local_48 = pMVar6;
      local_38 = Program::getFunction(local_68,pFVar12);
      pFVar16 = *(Function **)(pFVar12 + 0x50);
      local_40 = pFVar12 + 0x48;
      if (pFVar16 != local_40) {
        do {
          pFVar12 = pFVar16 + -0x18;
          if (pFVar16 == (Function *)0x0) {
            pFVar12 = (Function *)0x0;
          }
          local_58 = Func::getBlock(local_38,(BasicBlock *)pFVar12);
          for (pBVar15 = *(BasicBlock **)((BasicBlock *)pFVar12 + 0x30);
              pBVar15 != (BasicBlock *)pFVar12 + 0x28; pBVar15 = *(BasicBlock **)(pBVar15 + 8)) {
            pBVar13 = pBVar15 + -0x18;
            if (pBVar15 == (BasicBlock *)0x0) {
              pBVar13 = (BasicBlock *)0x0;
            }
            if ((((pBVar13[0x10] == (BasicBlock)0x53) &&
                 (lVar7 = *(long *)(pBVar13 + -0x20), lVar7 != 0)) &&
                (*(char *)(lVar7 + 0x10) == '\0')) &&
               (*(long *)(lVar7 + 0x18) == *(long *)(pBVar13 + 0x48))) {
              auVar17 = llvm::Value::getName();
              lVar7 = auVar17._0_8_;
              paVar1 = &local_a8.field_2;
              local_a8._M_dataplus._M_p = (pointer)paVar1;
              if (lVar7 == 0) {
                local_a8._M_string_length = 0;
                local_a8.field_2._M_local_buf[0] = '\0';
              }
              else {
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,lVar7,auVar17._8_8_ + lVar7);
              }
              iVar5 = std::__cxx11::string::compare((char *)&local_a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != paVar1) {
                operator_delete(local_a8._M_dataplus._M_p,
                                CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                         local_a8.field_2._M_local_buf[0]) + 1);
              }
              if (iVar5 == 0) {
                lVar7 = *(long *)(pBVar13 + -(ulong)(uint)(*(int *)(pBVar13 + 0x14) << 5));
                if (*(char *)(lVar7 + 0x10) != '\x16') {
                  lVar7 = 0;
                }
                expr = Func::getExpr(local_58->func,*(Value **)(*(long *)(lVar7 + 0x18) + 0x80));
                if (((expr != (Expr *)0x0) &&
                    ((bVar4 = RefExpr::classof(expr), !bVar4 ||
                     (expr = *(Expr **)&expr[1].kind, expr != (Expr *)0x0)))) &&
                   (bVar4 = Value::classof(expr), bVar4)) {
                  lVar7 = *(long *)(pBVar13 + (0x20 - (ulong)(uint)(*(int *)(pBVar13 + 0x14) << 5)))
                  ;
                  if (*(char *)(lVar7 + 0x10) != '\x16') {
                    lVar7 = 0;
                  }
                  pcVar2 = *(char **)(lVar7 + 0x18);
                  pcVar8 = (char *)0x0;
                  if ((pcVar2 != (char *)0x0) && (pcVar8 = pcVar2, *pcVar2 != '\x19')) {
                    pcVar8 = (char *)0x0;
                  }
                  if ((*(long *)(pcVar8 + (ulong)*(uint *)(pcVar8 + 8) * -8 + 8) != 0) &&
                     (llvm::MDString::getString(), extraout_RDX != 0)) {
                    local_60 = &(local_58->func->variableCounters)._M_h;
                    if (*(long *)(pcVar8 + (ulong)*(uint *)(pcVar8 + 8) * -8 + 8) == 0) {
LAB_001589aa:
                      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                      local_a8._M_string_length = 0;
                      local_a8.field_2._M_local_buf[0] = '\0';
                    }
                    else {
                      auVar17 = llvm::MDString::getString();
                      lVar7 = auVar17._0_8_;
                      if (lVar7 == 0) goto LAB_001589aa;
                      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_a8,lVar7,auVar17._8_8_ + lVar7);
                    }
                    iVar9 = std::
                            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            ::find(local_60,&local_a8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                      operator_delete(local_a8._M_dataplus._M_p,
                                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                               local_a8.field_2._M_local_buf[0]) + 1);
                    }
                    if (*(long *)(pcVar8 + (ulong)*(uint *)(pcVar8 + 8) * -8 + 8) == 0) {
LAB_00158a26:
                      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                      local_a8._M_string_length = 0;
                      local_a8.field_2._M_local_buf[0] = '\0';
                    }
                    else {
                      auVar17 = llvm::MDString::getString();
                      lVar7 = auVar17._0_8_;
                      if (lVar7 == 0) goto LAB_00158a26;
                      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_a8,lVar7,auVar17._8_8_ + lVar7);
                    }
                    if (iVar9.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                        ._M_cur == (__node_type *)0x0) {
                      if (*(long *)(pcVar8 + (ulong)*(uint *)(pcVar8 + 8) * -8 + 8) == 0) {
LAB_00158af7:
                        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                        local_88._M_string_length = 0;
                        local_88.field_2._M_local_buf[0] = '\0';
                      }
                      else {
                        auVar17 = llvm::MDString::getString();
                        lVar7 = auVar17._0_8_;
                        if (lVar7 == 0) goto LAB_00158af7;
                        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_88,lVar7,auVar17._8_8_ + lVar7);
                      }
                      pmVar10 = std::__detail::
                                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                              *)local_60,&local_88);
                      *pmVar10 = 1;
                    }
                    else {
                      __val = *(long *)((long)iVar9.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                              ._M_cur + 0x28) + 1;
                      *(ulong *)((long)iVar9.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                       ._M_cur + 0x28) = __val;
                      cVar14 = '\x01';
                      if (9 < __val) {
                        uVar11 = __val;
                        cVar3 = '\x04';
                        do {
                          cVar14 = cVar3;
                          if (uVar11 < 100) {
                            cVar14 = cVar14 + -2;
                            goto LAB_00158b2e;
                          }
                          if (uVar11 < 1000) {
                            cVar14 = cVar14 + -1;
                            goto LAB_00158b2e;
                          }
                          if (uVar11 < 10000) goto LAB_00158b2e;
                          bVar4 = 99999 < uVar11;
                          uVar11 = uVar11 / 10000;
                          cVar3 = cVar14 + '\x04';
                        } while (bVar4);
                        cVar14 = cVar14 + '\x01';
                      }
LAB_00158b2e:
                      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                      std::__cxx11::string::_M_construct((ulong)&local_88,cVar14);
                      std::__detail::__to_chars_10_impl<unsigned_long>
                                (local_88._M_dataplus._M_p,(uint)local_88._M_string_length,__val);
                      std::__cxx11::string::_M_append
                                ((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_88._M_dataplus._M_p != &local_88.field_2) {
                      operator_delete(local_88._M_dataplus._M_p,
                                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                               local_88.field_2._M_local_buf[0]) + 1);
                    }
                    std::__cxx11::string::_M_assign((string *)&expr[1].kind);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                      operator_delete(local_a8._M_dataplus._M_p,
                                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                               local_a8.field_2._M_local_buf[0]) + 1);
                    }
                  }
                }
              }
            }
          }
          pFVar16 = *(Function **)(pFVar16 + 8);
        } while (pFVar16 != local_40);
      }
      pMVar6 = *(Module **)(local_48 + 8);
    } while (pMVar6 != local_50);
  }
  Program::addPass(local_68,FindMetadataVariableNames);
  return;
}

Assistant:

void findMetadataVariableNames(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateAllocas));

    for (const auto& function : module->functions()) {
        auto* func = program.getFunction(&function);
        for (const auto& block : function) {
            auto* myBlock = func->getBlock(&block);

            for (const auto& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Call) {
                    const llvm::CallInst* CI = llvm::cast<llvm::CallInst>(&ins);
                    if (CI->getCalledFunction()) {
                        if (CI->getCalledFunction()->getName().str().compare("llvm.dbg.declare") == 0) {
                            setMetadataInfo(CI, myBlock);
                        }
                    }
                }
            }

        }
    }

    program.addPass(PassType::FindMetadataVariableNames);
}